

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O3

void BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command *commands,size_t n_commands,
               BlockSplitFromDecoder *literals_block_splits,size_t *current_block_literals,
               BlockSplitFromDecoder *cmds_block_splits,size_t *current_block_cmds,
               MetaBlockSplit *mb)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  size_t __n;
  undefined1 auVar6 [16];
  size_t sVar7;
  ulong uVar8;
  uint8_t *__dest;
  uint32_t *puVar9;
  HistogramLiteral *__s;
  ulong uVar10;
  Command *pCVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  HistogramCommand **in_stack_fffffffffffffd48;
  MemoryManager *pMVar20;
  BlockSplitterCommand cmd_blocks;
  anon_union_336_2_32013c24 lit_blocks;
  BlockSplitterDistance dist_blocks;
  
  uVar14 = (ulong)prev_byte2;
  uVar10 = (ulong)prev_byte;
  if (num_contexts == 1) {
    sVar13 = 0;
    sVar7 = n_commands;
    pCVar11 = commands;
    if (n_commands != 0) {
      do {
        sVar13 = sVar13 + pCVar11->insert_len_;
        sVar7 = sVar7 - 1;
        pCVar11 = pCVar11 + 1;
      } while (sVar7 != 0);
    }
    pMVar20 = m;
    InitBlockSplitterLiteral
              (m,&lit_blocks.plain,sVar13,(size_t)mb,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da),
               (size_t)&mb->literal_histograms,(BlockSplit *)&mb->literal_histograms_size,
               (HistogramLiteral **)in_stack_fffffffffffffd48,(size_t *)m);
    uVar18 = extraout_XMM0_Da;
    uVar19 = extraout_XMM0_Db;
    if (literals_block_splits != (BlockSplitFromDecoder *)0x0) {
      lit_blocks.plain.num_types_ = 0;
      BrotliSplitBlockLiteralsFromStored
                (m,commands,n_commands,pos,mask,lit_blocks.plain.split_,literals_block_splits,
                 current_block_literals);
      uVar18 = extraout_XMM0_Da_00;
      uVar19 = extraout_XMM0_Db_00;
    }
    InitBlockSplitterCommand
              (m,&cmd_blocks,n_commands,(size_t)&mb->command_split,(double)CONCAT44(uVar19,uVar18),
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               in_stack_fffffffffffffd48,(size_t *)pMVar20);
    InitBlockSplitterDistance
              (m,&dist_blocks,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)in_stack_fffffffffffffd48,(size_t *)pMVar20);
    if (cmds_block_splits != (BlockSplitFromDecoder *)0x0) {
      cmd_blocks.num_types_ = 0;
      BrotliSplitBlockCommandsFromStored
                (m,commands,n_commands,pos,mask,cmd_blocks.split_,cmds_block_splits,
                 current_block_cmds);
    }
    if (n_commands != 0) {
      sVar7 = 0;
      do {
        uVar14 = (ulong)commands[sVar7].insert_len_;
        uVar15 = commands[sVar7].copy_len_;
        uVar2 = commands[sVar7].cmd_prefix_;
        uVar10 = (ulong)commands[sVar7].dist_prefix_;
        if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
          BlockSplitterAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
        }
        else {
          BlockSplitterStoredAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
        }
        for (; uVar14 != 0; uVar14 = uVar14 - 1) {
          if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
            BlockSplitterAddSymbolLiteral(&lit_blocks.plain,(ulong)ringbuffer[pos & mask]);
          }
          else {
            BlockSplitterStoredAddSymbolLiteral(&lit_blocks.plain,(ulong)ringbuffer[pos & mask]);
          }
          pos = pos + 1;
        }
        uVar15 = uVar15 & 0x1ffffff;
        if ((uVar15 != 0) && (0x7f < uVar2)) {
          BlockSplitterAddSymbolDistance(&dist_blocks,(ulong)((uint)uVar10 & 0x3ff));
        }
        pos = pos + uVar15;
        sVar7 = sVar7 + 1;
      } while (sVar7 != n_commands);
    }
    if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockLiteral(&lit_blocks.plain,1);
    }
    else {
      BlockSplitterStoredFinishBlockLiteral(&lit_blocks.plain,1);
    }
    if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockCommand(&cmd_blocks,1);
    }
    else {
      BlockSplitterStoredFinishBlockCommand(&cmd_blocks,1);
    }
    BlockSplitterFinishBlockDistance(&dist_blocks,1);
  }
  else {
    uVar8 = 0;
    pCVar11 = commands;
    sVar7 = n_commands;
    if (n_commands != 0) {
      do {
        uVar8 = uVar8 + pCVar11->insert_len_;
        sVar7 = sVar7 - 1;
        pCVar11 = pCVar11 + 1;
      } while (sVar7 != 0);
      uVar8 = uVar8 >> 9;
    }
    lit_blocks.ctx.histograms_size_ = &mb->literal_histograms_size;
    uVar16 = 0x3ff;
    if (0x3ff < uVar8) {
      uVar16 = uVar8;
    }
    uVar8 = uVar16 + 1;
    lit_blocks.plain.alphabet_size_ = 0x100;
    lit_blocks.plain.min_block_size_ = num_contexts;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = num_contexts;
    sVar7 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar6,0);
    lit_blocks.plain.num_blocks_ = 0x200;
    lit_blocks.plain.num_types_ = 0x4079000000000000;
    lit_blocks.plain.split_ = (BlockSplit *)0x0;
    lit_blocks.ctx.split_ = &mb->literal_split;
    lit_blocks.plain.curr_histogram_ix_ = 0x200;
    lit_blocks.ctx.merge_last_count_ = 0;
    lit_blocks.plain.last_histogram_ix_[0] = 0;
    lit_blocks.plain.last_histogram_ix_[1] = 0;
    uVar5 = (mb->literal_split).types_alloc_size;
    lit_blocks.ctx.max_block_types_ = sVar7;
    if (uVar5 <= uVar16) {
      if (uVar5 == 0) {
        uVar5 = uVar8;
      }
      do {
        uVar12 = uVar5;
        uVar5 = uVar12 * 2;
      } while (uVar12 <= uVar16);
      __dest = (uint8_t *)BrotliAllocate(m,uVar12);
      __n = (mb->literal_split).types_alloc_size;
      if (__n != 0) {
        memcpy(__dest,(mb->literal_split).types,__n);
      }
      BrotliFree(m,(mb->literal_split).types);
      (mb->literal_split).types = __dest;
      (mb->literal_split).types_alloc_size = uVar12;
    }
    uVar5 = (mb->literal_split).lengths_alloc_size;
    if (uVar5 <= uVar16) {
      if (uVar5 == 0) {
        uVar5 = uVar8;
      }
      do {
        uVar12 = uVar5;
        uVar5 = uVar12 * 2;
      } while (uVar12 <= uVar16);
      puVar9 = (uint32_t *)BrotliAllocate(m,uVar12 * 4);
      sVar13 = (mb->literal_split).lengths_alloc_size;
      if (sVar13 != 0) {
        memcpy(puVar9,(mb->literal_split).lengths,sVar13 << 2);
      }
      BrotliFree(m,(mb->literal_split).lengths);
      (mb->literal_split).lengths = puVar9;
      (mb->literal_split).lengths_alloc_size = uVar12;
    }
    (mb->literal_split).num_blocks = uVar8;
    sVar7 = (sVar7 + 1) * num_contexts;
    mb->literal_histograms_size = sVar7;
    if (sVar7 == 0) {
      __s = (HistogramLiteral *)0x0;
    }
    else {
      __s = (HistogramLiteral *)BrotliAllocate(m,sVar7 * 0x410);
    }
    mb->literal_histograms = __s;
    lVar17 = num_contexts + (num_contexts == 0);
    lit_blocks.ctx.histograms_ = __s;
    do {
      memset(__s,0,0x408);
      __s->bit_cost_ = INFINITY;
      __s = __s + 1;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    uVar18 = 0;
    uVar19 = 0;
    lit_blocks.plain.last_entropy_[0] = 0.0;
    lit_blocks.plain.last_entropy_[1] = 0.0;
    pMVar20 = m;
    if (literals_block_splits != (BlockSplitFromDecoder *)0x0) {
      lit_blocks.plain.histograms_ = (HistogramLiteral *)0x0;
      BrotliSplitBlockLiteralsFromStored
                (m,commands,n_commands,pos,mask,lit_blocks.ctx.split_,literals_block_splits,
                 current_block_literals);
      uVar18 = extraout_XMM0_Da_02;
      uVar19 = extraout_XMM0_Db_02;
    }
    InitBlockSplitterCommand
              (m,&cmd_blocks,n_commands,(size_t)&mb->command_split,(double)CONCAT44(uVar19,uVar18),
               (size_t)&mb->command_histograms,(BlockSplit *)&mb->command_histograms_size,
               in_stack_fffffffffffffd48,(size_t *)pMVar20);
    InitBlockSplitterDistance
              (m,&dist_blocks,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)in_stack_fffffffffffffd48,(size_t *)pMVar20);
    if (cmds_block_splits != (BlockSplitFromDecoder *)0x0) {
      cmd_blocks.num_types_ = 0;
      BrotliSplitBlockCommandsFromStored
                (m,commands,n_commands,pos,mask,cmd_blocks.split_,cmds_block_splits,
                 current_block_cmds);
    }
    if (n_commands != 0) {
      sVar7 = 0;
      do {
        uVar8 = (ulong)commands[sVar7].insert_len_;
        uVar15 = commands[sVar7].copy_len_;
        uVar2 = commands[sVar7].cmd_prefix_;
        uVar3 = commands[sVar7].dist_prefix_;
        if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
          BlockSplitterAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
        }
        else {
          BlockSplitterStoredAddSymbolCommand(&cmd_blocks,(ulong)uVar2);
        }
        for (; uVar8 != 0; uVar8 = uVar8 - 1) {
          bVar1 = ringbuffer[pos & mask];
          uVar4 = static_context_map
                  [literal_context_lut[uVar14 + 0x100] | literal_context_lut[uVar10]];
          ((HistogramLiteral *)
          ((long)lit_blocks.ctx.histograms_ +
          (lit_blocks.plain.last_histogram_ix_[1] + uVar4) * 0x410))->data_[bVar1] =
               ((HistogramLiteral *)
               ((long)lit_blocks.ctx.histograms_ +
               (lit_blocks.plain.last_histogram_ix_[1] + uVar4) * 0x410))->data_[bVar1] + 1;
          ((HistogramLiteral *)
          ((long)lit_blocks.ctx.histograms_ +
          (lit_blocks.plain.last_histogram_ix_[1] + uVar4) * 0x410))->total_count_ =
               ((HistogramLiteral *)
               ((long)lit_blocks.ctx.histograms_ +
               (lit_blocks.plain.last_histogram_ix_[1] + uVar4) * 0x410))->total_count_ + 1;
          lit_blocks.plain.last_histogram_ix_[0] = lit_blocks.plain.last_histogram_ix_[0] + 1;
          if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
            if (lit_blocks.plain.last_histogram_ix_[0] == lit_blocks.plain.curr_histogram_ix_) {
              ContextBlockSplitterFinishBlock(&lit_blocks.ctx,pMVar20,0);
            }
          }
          else if (lit_blocks.plain.last_histogram_ix_[0] ==
                   (lit_blocks.ctx.split_)->lengths[lit_blocks.ctx.num_blocks_]) {
            ContextBlockSplitterStoredFinishBlockLiterals(&lit_blocks.ctx,pMVar20,0);
          }
          pos = pos + 1;
          uVar14 = uVar10;
          uVar10 = (ulong)bVar1;
        }
        uVar8 = (ulong)(uVar15 & 0x1ffffff);
        pos = pos + uVar8;
        if (uVar8 != 0) {
          uVar14 = (ulong)ringbuffer[pos - 2 & mask];
          uVar10 = (ulong)ringbuffer[pos - 1 & mask];
          if (0x7f < uVar2) {
            BlockSplitterAddSymbolDistance(&dist_blocks,(ulong)(uVar3 & 0x3ff));
          }
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != n_commands);
    }
    if (literals_block_splits == (BlockSplitFromDecoder *)0x0) {
      ContextBlockSplitterFinishBlock(&lit_blocks.ctx,pMVar20,1);
    }
    else {
      ContextBlockSplitterStoredFinishBlockLiterals(&lit_blocks.ctx,pMVar20,1);
    }
    if (cmds_block_splits == (BlockSplitFromDecoder *)0x0) {
      BlockSplitterFinishBlockCommand(&cmd_blocks,1);
    }
    else {
      BlockSplitterStoredFinishBlockCommand(&cmd_blocks,1);
    }
    BlockSplitterFinishBlockDistance(&dist_blocks,1);
    sVar7 = (mb->literal_split).num_types;
    mb->literal_context_map_size = sVar7 << 6;
    if (sVar7 << 6 == 0) {
      puVar9 = (uint32_t *)0x0;
    }
    else {
      puVar9 = (uint32_t *)BrotliAllocate(pMVar20,sVar7 << 8);
      sVar7 = (mb->literal_split).num_types;
    }
    mb->literal_context_map = puVar9;
    if (sVar7 != 0) {
      sVar13 = 0;
      do {
        lVar17 = 0;
        do {
          puVar9[lVar17] = static_context_map[lVar17] + (int)sVar13 * (int)num_contexts;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x40);
        sVar13 = sVar13 + 1;
        puVar9 = puVar9 + 0x40;
      } while (sVar13 != sVar7);
    }
  }
  return;
}

Assistant:

void BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                const BlockSplitFromDecoder* literals_block_splits,
                                size_t* current_block_literals,
                                const BlockSplitFromDecoder* cmds_block_splits,
                                size_t* current_block_cmds,
                                MetaBlockSplit* mb) {
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, 1, NULL, commands, n_commands,
        literals_block_splits, current_block_literals,
        cmds_block_splits, current_block_cmds, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, num_contexts, static_context_map,
        commands, n_commands, literals_block_splits, current_block_literals,
        cmds_block_splits, current_block_cmds, mb);
  }
}